

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O3

optional<CNetAddr> *
LookupHost(optional<CNetAddr> *__return_storage_ptr__,string *name,bool fAllowLookup,
          DNSLookupFn dns_lookup_function)

{
  DNSLookupFn dns_lookup_function_00;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_RCX;
  bool *pbVar1;
  undefined7 in_register_00000011;
  long in_FS_OFFSET;
  vector<CNetAddr,_std::allocator<CNetAddr>_> addresses;
  _Function_base in_stack_ffffffffffffff98;
  pointer in_stack_ffffffffffffffb0;
  vector<CNetAddr,_std::allocator<CNetAddr>_> local_40;
  long local_28;
  
  pbVar1 = (bool *)(CONCAT71(in_register_00000011,fAllowLookup) & 0xffffffff);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&stack0xffffffffffffffa0,in_RCX);
  dns_lookup_function_00._M_invoker = (_Invoker_type)in_stack_ffffffffffffffb0;
  dns_lookup_function_00.super__Function_base = in_stack_ffffffffffffff98;
  LookupHost(&local_40,name,1,SUB81(pbVar1,0),dns_lookup_function_00);
  if (in_stack_ffffffffffffffb0 != (pointer)0x0) {
    (*(code *)in_stack_ffffffffffffffb0)
              ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)&stack0xffffffffffffffa0,
               (_Any_data *)&stack0xffffffffffffffa0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3,pbVar1);
  }
  if (local_40.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_40.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)__return_storage_ptr__,
               &(local_40.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
                 super__Vector_impl_data._M_start)->m_addr);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<CNetAddr,_false,_false>)._M_payload.
             super__Optional_payload<CNetAddr,_true,_false,_false>.
             super__Optional_payload_base<CNetAddr>._M_payload + 0x18) =
         *(undefined8 *)
          &(local_40.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
            super__Vector_impl_data._M_start)->m_net;
  }
  (__return_storage_ptr__->super__Optional_base<CNetAddr,_false,_false>)._M_payload.
  super__Optional_payload<CNetAddr,_true,_false,_false>.super__Optional_payload_base<CNetAddr>.
  _M_engaged = local_40.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
               super__Vector_impl_data._M_start !=
               local_40.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
               super__Vector_impl_data._M_finish;
  std::vector<CNetAddr,_std::allocator<CNetAddr>_>::~vector(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<CNetAddr> LookupHost(const std::string& name, bool fAllowLookup, DNSLookupFn dns_lookup_function)
{
    const std::vector<CNetAddr> addresses{LookupHost(name, 1, fAllowLookup, dns_lookup_function)};
    return addresses.empty() ? std::nullopt : std::make_optional(addresses.front());
}